

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagr_fe.h
# Opt level: O3

Matrix<double,__1,__1,_0,__1,__1> * __thiscall
lf::uscalfe::FeLagrangeO2Tria<double>::EvalReferenceShapeFunctions
          (Matrix<double,__1,__1,_0,__1,__1> *__return_storage_ptr__,FeLagrangeO2Tria<double> *this,
          MatrixXd *refcoords)

{
  pointer pcVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Index IVar7;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar8;
  scalar_constant_op<double> sVar9;
  scalar_constant_op<double> sVar10;
  double dVar11;
  variable_if_dynamic<long,__1> vVar12;
  double *pdVar13;
  double *pdVar14;
  variable_if_dynamic<long,__1> vVar15;
  variable_if_dynamic<long,__1> vVar16;
  XprTypeNested pMVar17;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> x0
  ;
  stringstream ss;
  ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> x1
  ;
  scalar_difference_op<double,_double> local_6f1;
  Matrix<double,__1,__1,_0,__1,__1> *local_6f0;
  undefined1 local_6e8 [16];
  variable_if_dynamic<long,__1> local_6d8;
  XprTypeNested pMStack_6d0;
  variable_if_dynamic<long,__1> local_6c8;
  variable_if_dynamic<long,__1> vStack_6c0;
  Index local_6b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_6b0;
  undefined1 local_650 [32];
  scalar_constant_op<double> local_630;
  double *local_628;
  Index IStack_620;
  variable_if_dynamic<long,__1> local_618;
  variable_if_dynamic<long,__1> vStack_610;
  scalar_constant_op<double> local_608;
  variable_if_dynamic<long,__1> vStack_600;
  Index IStack_5f8;
  variable_if_dynamic<long,__1> local_5f0;
  XprTypeNested pMStack_5e8;
  variable_if_dynamic<long,__1> local_5e0;
  variable_if_dynamic<long,__1> vStack_5d8;
  XprTypeNested local_5d0;
  variable_if_dynamic<long,__1> vStack_5c8;
  variable_if_dynamic<long,__1> local_5c0;
  Index IStack_5b8;
  variable_if_dynamic<long,__1> local_5b0;
  variable_if_dynamic<long,__1> vStack_5a8;
  scalar_constant_op<double> local_5a0;
  variable_if_dynamic<long,__1> vStack_598;
  Index local_590;
  double *local_578;
  undefined1 auStack_570 [16];
  variable_if_dynamic<long,__1> vStack_560;
  scalar_constant_op<double> local_558;
  variable_if_dynamic<long,__1> vStack_550;
  Index IStack_548;
  variable_if_dynamic<long,__1> local_540;
  XprTypeNested pMStack_538;
  variable_if_dynamic<long,__1> local_530;
  variable_if_dynamic<long,__1> vStack_528;
  Index local_520;
  double *local_510;
  undefined8 uStack_508;
  variable_if_dynamic<long,__1> local_500;
  XprTypeNested pMStack_4f8;
  variable_if_dynamic<long,__1> local_4f0;
  variable_if_dynamic<long,__1> vStack_4e8;
  Index local_4e0;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> local_4c8;
  undefined1 local_490 [16];
  variable_if_dynamic<long,__1> local_480;
  variable_if_dynamic<long,__1> vStack_478;
  scalar_constant_op<double> local_470;
  variable_if_dynamic<long,__1> vStack_468;
  Index local_460;
  variable_if_dynamic<long,__1> local_458;
  variable_if_dynamic<long,__1> vStack_450;
  scalar_constant_op<double> local_448;
  variable_if_dynamic<long,__1> vStack_440;
  Index IStack_438;
  variable_if_dynamic<long,__1> local_430;
  XprTypeNested pMStack_428;
  variable_if_dynamic<long,__1> local_420;
  variable_if_dynamic<long,__1> vStack_418;
  XprTypeNested local_410;
  variable_if_dynamic<long,__1> vStack_408;
  variable_if_dynamic<long,__1> local_400;
  Index IStack_3f8;
  variable_if_dynamic<long,__1> local_3f0;
  variable_if_dynamic<long,__1> vStack_3e8;
  scalar_constant_op<double> local_3e0;
  variable_if_dynamic<long,__1> vStack_3d8;
  Index local_3d0;
  double *local_3b8;
  undefined1 auStack_3b0 [16];
  variable_if_dynamic<long,__1> vStack_3a0;
  scalar_constant_op<double> local_398;
  variable_if_dynamic<long,__1> vStack_390;
  Index IStack_388;
  variable_if_dynamic<long,__1> local_380;
  XprTypeNested pMStack_378;
  variable_if_dynamic<long,__1> local_370;
  variable_if_dynamic<long,__1> vStack_368;
  Index local_360;
  double *local_350;
  undefined8 uStack_348;
  variable_if_dynamic<long,__1> local_340;
  XprTypeNested pMStack_338;
  variable_if_dynamic<long,__1> local_330;
  variable_if_dynamic<long,__1> vStack_328;
  Index local_320;
  undefined1 local_308 [16];
  variable_if_dynamic<long,__1> local_2f8;
  XprTypeNested pMStack_2f0;
  variable_if_dynamic<long,__1> local_2e8;
  variable_if_dynamic<long,__1> vStack_2e0;
  Index local_2d8;
  double local_2d0;
  long local_2c8;
  long local_2c0;
  scalar_constant_op<double> local_2b8;
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0 [6];
  variable_if_dynamic<long,__1> local_238;
  undefined1 local_208 [24];
  scalar_constant_op<double> local_1f0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
  local_160;
  undefined1 local_100 [208];
  
  if ((refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
      == 2) {
    IVar7 = (refcoords->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_cols;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_data = (double *)0x0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_rows = 0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
    m_storage.m_cols = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
              (&__return_storage_ptr__->
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,6,
               (ulong)(uint)IVar7);
    local_6f0 = __return_storage_ptr__;
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_490,
               refcoords,0);
    local_6b8 = local_460;
    local_6c8.m_value = (long)local_470.m_other;
    vStack_6c0.m_value = vStack_468.m_value;
    local_6d8.m_value = local_480.m_value;
    pMStack_6d0 = (XprTypeNested)vStack_478.m_value;
    local_6e8._0_8_ = local_490._0_8_;
    local_6e8._8_8_ = local_490._8_8_;
    Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_490,
               refcoords,1);
    local_2d8 = local_460;
    local_2e8.m_value = (long)local_470.m_other;
    vStack_2e0.m_value = vStack_468.m_value;
    local_2f8.m_value = local_480.m_value;
    pMStack_2f0 = (XprTypeNested)vStack_478.m_value;
    local_308._0_8_ = local_490._0_8_;
    local_308._8_8_ = local_490._8_8_;
    local_160._0_8_ = 1.0;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_208,1,local_6d8.m_value,(scalar_constant_op<double> *)&local_160);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp(&local_6b0,(Lhs *)local_208,(Rhs *)local_6e8,
                    (scalar_difference_op<double,_double> *)&local_4c8);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_2b0,&local_6b0,(Rhs *)local_308,
                    (scalar_difference_op<double,_double> *)local_208);
    local_160._0_8_ = 2.0;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_208,1,local_238.m_value,(scalar_constant_op<double> *)&local_160);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                     *)local_100,(Lhs *)local_208,(Rhs *)local_2b0,
                    (scalar_product_op<double,_double> *)&local_4c8);
    local_2b8.m_other = 0.5;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)&local_4c8,1,local_6d8.m_value,&local_2b8);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp(&local_160,(Lhs *)&local_4c8,(Rhs *)local_6e8,&local_6f1);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_208,&local_160,(Rhs *)local_308,
                    (scalar_difference_op<double,_double> *)&local_4c8);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                     *)local_650,(Lhs *)local_100,(Rhs *)local_208,
                    (scalar_product_op<double,_double> *)&local_4c8);
    vStack_478.m_value = local_650._24_8_;
    local_470.m_other = local_630.m_other;
    vStack_450.m_value = vStack_610.m_value;
    local_448.m_other = local_608.m_other;
    vStack_440.m_value = vStack_600.m_value;
    IStack_438 = IStack_5f8;
    local_430.m_value = local_5f0.m_value;
    pMStack_428 = pMStack_5e8;
    local_420.m_value = local_5e0.m_value;
    vStack_418.m_value = vStack_5d8.m_value;
    local_410 = local_5d0;
    local_400.m_value = local_5c0.m_value;
    IStack_3f8 = IStack_5b8;
    local_3f0.m_value = local_5b0.m_value;
    vStack_3e8.m_value = vStack_5a8.m_value;
    local_3e0.m_other = local_5a0.m_other;
    vStack_3d8.m_value = vStack_598.m_value;
    local_3d0 = local_590;
    vStack_3a0.m_value = vStack_560.m_value;
    local_398.m_other = local_558.m_other;
    local_360 = local_520;
    local_370.m_value = local_530.m_value;
    vStack_368.m_value = vStack_528.m_value;
    local_380.m_value = local_540.m_value;
    pMStack_378 = pMStack_538;
    vStack_390.m_value = vStack_550.m_value;
    IStack_388 = IStack_548;
    local_320 = local_4e0;
    local_330.m_value = local_4f0.m_value;
    vStack_328.m_value = vStack_4e8.m_value;
    local_340.m_value = local_500.m_value;
    pMStack_338 = pMStack_4f8;
    local_350 = local_510;
    uStack_348 = uStack_508;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              (&local_4c8,__return_storage_ptr__,0);
    pdVar13 = local_350;
    vVar12.m_value = vStack_390.m_value;
    vVar16.m_value = local_400.m_value;
    vVar15.m_value = vStack_440.m_value;
    sVar10.m_other = local_448.m_other;
    sVar9.m_other = local_470.m_other;
    local_2c0 = (pMStack_428->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                m_storage.m_rows;
    local_2c8 = *(Index *)(vStack_3e8.m_value + 8);
    local_2d0 = local_398.m_other;
    lVar3 = (pMStack_378->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows;
    lVar4 = (pMStack_338->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>,double,double>
              (&local_4c8,
               (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
                *)local_490,(assign_op<double,_double> *)&local_2b8);
    if (0 < local_4c8.
            super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
            super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
            super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
            m_cols.m_value) {
      lVar5 = ((local_4c8.
                super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
               .m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      do {
        *local_4c8.
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
         m_data = ((local_2d0 - *(double *)vVar12.m_value) - *pdVar13) *
                  ((sVar10.m_other - *(double *)vVar15.m_value) - *(double *)vVar16.m_value) *
                  sVar9.m_other;
        pdVar13 = pdVar13 + lVar4;
        vVar12.m_value = vVar12.m_value + lVar3 * 8;
        vVar16.m_value = vVar16.m_value + local_2c8 * 8;
        vVar15.m_value = vVar15.m_value + local_2c0 * 8;
        local_4c8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
        m_data = local_4c8.
                 super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                 .m_data + lVar5;
        local_4c8.
        super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
        m_cols.m_value =
             local_4c8.
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>.
             super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>.
             m_cols.m_value + -1;
      } while ((double)local_4c8.
                       super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>,_0>
                       .m_cols.m_value != 0.0);
    }
    local_208._0_8_ = &DAT_4000000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_2b0,1,local_6d8.m_value,(scalar_constant_op<double> *)local_208);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_100,(Lhs *)local_2b0,(Rhs *)local_6e8,
                    (scalar_product_op<double,_double> *)&local_6b0);
    pMVar8 = local_6f0;
    local_6b0._0_8_ = 0.5;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_208,1,local_6d8.m_value,(scalar_constant_op<double> *)&local_6b0);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                     *)local_2b0,(Lhs *)local_6e8,(Rhs *)local_208,
                    (scalar_difference_op<double,_double> *)&local_160);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                     *)local_650,(Lhs *)local_100,(Rhs *)local_2b0,
                    (scalar_product_op<double,_double> *)local_208);
    vStack_478.m_value = local_650._24_8_;
    local_470.m_other = local_630.m_other;
    vStack_468.m_value = (long)local_628;
    local_460 = IStack_620;
    local_458.m_value = local_618.m_value;
    vStack_450.m_value = vStack_610.m_value;
    local_448.m_other = local_608.m_other;
    vStack_440.m_value = vStack_600.m_value;
    IStack_438 = IStack_5f8;
    pMStack_428 = pMStack_5e8;
    local_420.m_value = local_5e0.m_value;
    vStack_418.m_value = vStack_5d8.m_value;
    local_410 = local_5d0;
    vStack_408.m_value = vStack_5c8.m_value;
    local_400.m_value = local_5c0.m_value;
    IStack_3f8 = IStack_5b8;
    vStack_3e8.m_value = vStack_5a8.m_value;
    local_3e0.m_other = local_5a0.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_208,pMVar8,1);
    sVar10.m_other = local_3e0.m_other;
    pMVar17 = pMStack_428;
    vVar15.m_value = vStack_468.m_value;
    sVar9.m_other = local_470.m_other;
    lVar3 = *(long *)(vStack_450.m_value + 8);
    lVar4 = (local_410->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>const>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_208,
               (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>_>
                *)local_490,(assign_op<double,_double> *)&local_6b0);
    if (0 < (long)local_208._16_8_) {
      lVar5 = *(long *)((long)local_1f0.m_other + 8);
      dVar11 = (double)local_208._16_8_;
      do {
        *(double *)local_208._0_8_ =
             ((double)(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data - sVar10.m_other) * *(double *)vVar15.m_value * sVar9.m_other
        ;
        pMVar17 = (XprTypeNested)
                  ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          ).m_storage.m_data + lVar4 * 8);
        vVar15.m_value = vVar15.m_value + lVar3 * 8;
        local_208._0_8_ = local_208._0_8_ + lVar5 * 8;
        dVar11 = (double)((long)dVar11 + -1);
      } while (dVar11 != 0.0);
    }
    local_208._0_8_ = &DAT_4000000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_2b0,1,local_2f8.m_value,(scalar_constant_op<double> *)local_208);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_100,(Lhs *)local_2b0,(Rhs *)local_308,
                    (scalar_product_op<double,_double> *)&local_6b0);
    local_6b0._0_8_ = &DAT_3fe0000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_208,1,local_2f8.m_value,(scalar_constant_op<double> *)&local_6b0);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>
                     *)local_2b0,(Lhs *)local_308,(Rhs *)local_208,
                    (scalar_difference_op<double,_double> *)&local_160);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>
                     *)local_650,(Lhs *)local_100,(Rhs *)local_2b0,
                    (scalar_product_op<double,_double> *)local_208);
    vStack_478.m_value = local_650._24_8_;
    local_470.m_other = local_630.m_other;
    vStack_468.m_value = (long)local_628;
    local_460 = IStack_620;
    local_458.m_value = local_618.m_value;
    vStack_450.m_value = vStack_610.m_value;
    local_448.m_other = local_608.m_other;
    vStack_440.m_value = vStack_600.m_value;
    IStack_438 = IStack_5f8;
    pMStack_428 = pMStack_5e8;
    local_420.m_value = local_5e0.m_value;
    vStack_418.m_value = vStack_5d8.m_value;
    local_410 = local_5d0;
    vStack_408.m_value = vStack_5c8.m_value;
    local_400.m_value = local_5c0.m_value;
    IStack_3f8 = IStack_5b8;
    vStack_3e8.m_value = vStack_5a8.m_value;
    local_3e0.m_other = local_5a0.m_other;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_208,pMVar8,2);
    sVar10.m_other = local_3e0.m_other;
    pMVar17 = pMStack_428;
    vVar15.m_value = vStack_468.m_value;
    sVar9.m_other = local_470.m_other;
    lVar3 = *(long *)(vStack_450.m_value + 8);
    lVar4 = (local_410->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const>const>const>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_208,
               (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>_>_>_>
                *)local_490,(assign_op<double,_double> *)&local_6b0);
    if (0 < (long)local_208._16_8_) {
      lVar5 = *(long *)((long)local_1f0.m_other + 8);
      pdVar13 = (double *)local_208._0_8_;
      do {
        *pdVar13 = ((double)(pMVar17->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_data - sVar10.m_other) *
                   *(double *)vVar15.m_value * sVar9.m_other;
        pMVar17 = (XprTypeNested)
                  ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          ).m_storage.m_data + lVar4 * 8);
        vVar15.m_value = vVar15.m_value + lVar3 * 8;
        pdVar13 = pdVar13 + lVar5;
        local_208._16_8_ = local_208._16_8_ + -1;
      } while ((double)local_208._16_8_ != 0.0);
    }
    local_160._0_8_ = 1.0;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)&local_6b0,1,local_6d8.m_value,(scalar_constant_op<double> *)&local_160);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_208,(Lhs *)&local_6b0,(Rhs *)local_6e8,
                    (scalar_difference_op<double,_double> *)&local_4c8);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_2b0,(Lhs *)local_208,(Rhs *)local_308,
                    (scalar_difference_op<double,_double> *)&local_6b0);
    local_160._0_8_ = &DAT_4010000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)&local_6b0,1,local_238.m_value,(scalar_constant_op<double> *)&local_160);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                     *)local_100,(Lhs *)&local_6b0,(Rhs *)local_2b0,
                    (scalar_product_op<double,_double> *)&local_4c8);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_650,(Lhs *)local_100,(Rhs *)local_6e8,
                    (scalar_product_op<double,_double> *)&local_6b0);
    vStack_478.m_value = local_650._24_8_;
    local_470.m_other = local_630.m_other;
    vStack_450.m_value = vStack_610.m_value;
    local_448.m_other = local_608.m_other;
    vStack_440.m_value = vStack_600.m_value;
    IStack_438 = IStack_5f8;
    local_430.m_value = local_5f0.m_value;
    pMStack_428 = pMStack_5e8;
    local_420.m_value = local_5e0.m_value;
    vStack_418.m_value = vStack_5d8.m_value;
    local_410 = local_5d0;
    local_400.m_value = local_5c0.m_value;
    IStack_3f8 = IStack_5b8;
    local_3f0.m_value = local_5b0.m_value;
    vStack_3e8.m_value = vStack_5a8.m_value;
    local_3e0.m_other = local_5a0.m_other;
    vStack_3d8.m_value = vStack_598.m_value;
    local_3d0 = local_590;
    IStack_388 = IStack_548;
    local_398.m_other = local_558.m_other;
    vStack_390.m_value = vStack_550.m_value;
    auStack_3b0._8_8_ = auStack_570._8_8_;
    vStack_3a0.m_value = vStack_560.m_value;
    local_3b8 = local_578;
    auStack_3b0._0_8_ = auStack_570._0_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_6b0,pMVar8,3)
    ;
    pdVar13 = local_3b8;
    vVar16.m_value = local_400.m_value;
    vVar15.m_value = vStack_440.m_value;
    sVar10.m_other = local_448.m_other;
    sVar9.m_other = local_470.m_other;
    lVar3 = (pMStack_428->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows;
    lVar4 = *(Index *)(vStack_3e8.m_value + 8);
    lVar5 = *(long *)(vStack_3a0.m_value + 8);
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_6b0,
               (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                *)local_490,(assign_op<double,_double> *)&local_160);
    if (0 < local_6b0.m_lhs.m_cols.m_value) {
      lVar6 = *(long *)((long)local_6b0.m_lhs.m_functor.m_other + 8);
      vVar12.m_value = local_6b0.m_lhs.m_cols.m_value;
      pdVar14 = (double *)local_6b0._0_8_;
      do {
        *pdVar14 = ((sVar10.m_other - *(double *)vVar15.m_value) - *(double *)vVar16.m_value) *
                   sVar9.m_other * *pdVar13;
        pdVar13 = pdVar13 + lVar5;
        vVar16.m_value = vVar16.m_value + lVar4 * 8;
        vVar15.m_value = vVar15.m_value + lVar3 * 8;
        pdVar14 = pdVar14 + lVar6;
        vVar12.m_value = vVar12.m_value + -1;
      } while ((double)vVar12.m_value != 0.0);
    }
    local_208._0_8_ = &DAT_4010000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)local_2b0,1,local_6d8.m_value,(scalar_constant_op<double> *)local_208);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_100,(Lhs *)local_2b0,(Rhs *)local_6e8,
                    (scalar_product_op<double,_double> *)&local_6b0);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_650,(Lhs *)local_100,(Rhs *)local_308,
                    (scalar_product_op<double,_double> *)local_2b0);
    sVar9.m_other = local_630.m_other;
    pMVar8 = local_6f0;
    vStack_478.m_value = local_650._24_8_;
    local_470.m_other = local_630.m_other;
    vStack_468.m_value = (long)local_628;
    local_460 = IStack_620;
    local_458.m_value = local_618.m_value;
    vStack_450.m_value = vStack_610.m_value;
    local_448.m_other = local_608.m_other;
    vStack_440.m_value = vStack_600.m_value;
    IStack_438 = IStack_5f8;
    pMStack_428 = pMStack_5e8;
    local_420.m_value = local_5e0.m_value;
    vStack_418.m_value = vStack_5d8.m_value;
    local_410 = local_5d0;
    vStack_408.m_value = vStack_5c8.m_value;
    local_400.m_value = local_5c0.m_value;
    IStack_3f8 = IStack_5b8;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_2b0,local_6f0,
               4);
    pMVar17 = pMStack_428;
    vVar15.m_value = vStack_468.m_value;
    lVar3 = *(long *)(vStack_450.m_value + 8);
    lVar4 = (local_410->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_rows;
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)local_2b0,
               (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                *)local_490,(assign_op<double,_double> *)local_208);
    if (0 < (long)local_2a0[0]._0_8_) {
      lVar5 = *(long *)(local_2a0[0]._8_8_ + 8);
      do {
        *(double *)local_2b0._0_8_ =
             *(double *)vVar15.m_value * sVar9.m_other *
             (double)(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data;
        pMVar17 = (XprTypeNested)
                  ((long)&(pMVar17->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                          ).m_storage.m_data + lVar4 * 8);
        vVar15.m_value = vVar15.m_value + lVar3 * 8;
        local_2b0._0_8_ = local_2b0._0_8_ + lVar5 * 8;
        local_2a0[0]._0_8_ = local_2a0[0]._0_8_ + -1;
      } while ((double)local_2a0[0]._0_8_ != 0.0);
    }
    local_160._0_8_ = 1.0;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)&local_6b0,1,local_6d8.m_value,(scalar_constant_op<double> *)&local_160);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_208,(Lhs *)&local_6b0,(Rhs *)local_6e8,
                    (scalar_difference_op<double,_double> *)&local_4c8);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_2b0,(Lhs *)local_208,(Rhs *)local_308,
                    (scalar_difference_op<double,_double> *)&local_6b0);
    local_160._0_8_ = &DAT_4010000000000000;
    Eigen::
    CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>
    ::CwiseNullaryOp((CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>
                      *)&local_6b0,1,local_238.m_value,(scalar_constant_op<double> *)&local_160);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                     *)local_100,(Lhs *)&local_6b0,(Rhs *)local_2b0,
                    (scalar_product_op<double,_double> *)&local_4c8);
    Eigen::
    CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,_-1,_1,_1,_-1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>_>
    ::CwiseBinaryOp((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>
                     *)local_650,(Lhs *)local_100,(Rhs *)local_308,
                    (scalar_product_op<double,_double> *)&local_6b0);
    vStack_478.m_value = local_650._24_8_;
    local_470.m_other = local_630.m_other;
    vStack_450.m_value = vStack_610.m_value;
    local_448.m_other = local_608.m_other;
    vStack_440.m_value = vStack_600.m_value;
    IStack_438 = IStack_5f8;
    local_430.m_value = local_5f0.m_value;
    pMStack_428 = pMStack_5e8;
    local_420.m_value = local_5e0.m_value;
    vStack_418.m_value = vStack_5d8.m_value;
    local_410 = local_5d0;
    local_400.m_value = local_5c0.m_value;
    IStack_3f8 = IStack_5b8;
    local_3f0.m_value = local_5b0.m_value;
    vStack_3e8.m_value = vStack_5a8.m_value;
    local_3e0.m_other = local_5a0.m_other;
    vStack_3d8.m_value = vStack_598.m_value;
    local_3d0 = local_590;
    IStack_388 = IStack_548;
    local_398.m_other = local_558.m_other;
    vStack_390.m_value = vStack_550.m_value;
    auStack_3b0._8_8_ = auStack_570._8_8_;
    vStack_3a0.m_value = vStack_560.m_value;
    local_3b8 = local_578;
    auStack_3b0._0_8_ = auStack_570._0_8_;
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_6b0,pMVar8,5)
    ;
    pdVar13 = local_3b8;
    vVar16.m_value = local_400.m_value;
    vVar15.m_value = vStack_440.m_value;
    lVar3 = (pMStack_428->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows;
    lVar4 = *(Index *)(vStack_3e8.m_value + 8);
    lVar5 = *(long *)(vStack_3a0.m_value + 8);
    Eigen::internal::
    resize_if_allowed<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>,Eigen::MatrixWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,1,_1,1,1,_1>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const,Eigen::ArrayWrapper<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>,double,double>
              ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false> *)&local_6b0,
               (MatrixWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_1,__1,_1,_1,__1>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
                *)local_490,(assign_op<double,_double> *)&local_160);
    if (0 < local_6b0.m_lhs.m_cols.m_value) {
      lVar6 = *(long *)((long)local_6b0.m_lhs.m_functor.m_other + 8);
      do {
        *(double *)local_6b0._0_8_ =
             ((local_608.m_other - *(double *)vVar15.m_value) - *(double *)vVar16.m_value) *
             local_630.m_other * *pdVar13;
        pdVar13 = pdVar13 + lVar5;
        vVar16.m_value = vVar16.m_value + lVar4 * 8;
        vVar15.m_value = vVar15.m_value + lVar3 * 8;
        local_6b0._0_8_ = local_6b0._0_8_ + lVar6 * 8;
        local_6b0.m_lhs.m_cols.m_value = local_6b0.m_lhs.m_cols.m_value + -1;
      } while ((double)local_6b0.m_lhs.m_cols.m_value != 0.0);
    }
    return local_6f0;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_490);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_480,"Reference coordinates must be 2-vectors",0x27);
  pcVar1 = local_650 + 0x10;
  local_650._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_650,"refcoords.rows() == 2","");
  pcVar2 = local_100 + 0x10;
  local_100._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed((string *)local_650,(string *)local_100,0x1cd,(string *)local_2b0);
  if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
    operator_delete((void *)local_2b0._0_8_,local_2a0[0]._M_allocated_capacity + 1);
  }
  if ((pointer)local_100._0_8_ != pcVar2) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if ((pointer)local_650._0_8_ != pcVar1) {
    operator_delete((void *)local_650._0_8_,local_650._16_8_ + 1);
  }
  local_650._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_650,"false","");
  local_100._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/lagr_fe.h"
             ,"");
  local_2b0._0_8_ = local_2b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"");
  base::AssertionFailed((string *)local_650,(string *)local_100,0x1cd,(string *)local_2b0);
  std::__cxx11::string::~string((string *)local_2b0);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_650);
  abort();
}

Assistant:

[[nodiscard]] Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic>
  EvalReferenceShapeFunctions(const Eigen::MatrixXd& refcoords) const override {
    LF_ASSERT_MSG(refcoords.rows() == 2,
                  "Reference coordinates must be 2-vectors");
    // Number of evaluation points
    const size_type n_pts(refcoords.cols());
    // Result returned in 6 x P matrix
    Eigen::Matrix<SCALAR, Eigen::Dynamic, Eigen::Dynamic> result(6, n_pts);
    // Convert to array type for componentwise operations
    auto x0 = refcoords.row(0).array();
    auto x1 = refcoords.row(1).array();
    // Compound evaluation of formulas for reference shape functions
    result.row(0) = (2.0 * (1 - x0 - x1) * (0.5 - x0 - x1)).matrix();
    result.row(1) = (2.0 * x0 * (x0 - 0.5)).matrix();
    result.row(2) = (2.0 * x1 * (x1 - 0.5)).matrix();
    result.row(3) = (4.0 * (1 - x0 - x1) * x0).matrix();
    result.row(4) = (4.0 * x0 * x1).matrix();
    result.row(5) = (4.0 * (1 - x0 - x1) * x1).matrix();
    return result;
  }